

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O2

double GetMBSSIM(uint8_t *yuv1,uint8_t *yuv2)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double local_50;
  
  local_50 = 0.0;
  for (iVar2 = 3; iVar2 != 0xd; iVar2 = iVar2 + 1) {
    for (iVar1 = 3; iVar1 != 0xd; iVar1 = iVar1 + 1) {
      dVar3 = (*VP8SSIMGetClipped)(yuv1,0x20,yuv2,0x20,iVar1,iVar2,0x10,0x10);
      local_50 = local_50 + dVar3;
    }
  }
  for (iVar2 = 1; iVar2 != 7; iVar2 = iVar2 + 1) {
    for (iVar1 = 1; iVar1 != 7; iVar1 = iVar1 + 1) {
      dVar3 = (*VP8SSIMGetClipped)(yuv1 + 0x10,0x20,yuv2 + 0x10,0x20,iVar2,iVar1,8,8);
      dVar4 = (*VP8SSIMGetClipped)(yuv1 + 0x18,0x20,yuv2 + 0x18,0x20,iVar2,iVar1,8,8);
      local_50 = local_50 + dVar3 + dVar4;
    }
  }
  return local_50;
}

Assistant:

static double GetMBSSIM(const uint8_t* yuv1, const uint8_t* yuv2) {
  int x, y;
  double sum = 0.;

  // compute SSIM in a 10 x 10 window
  for (y = VP8_SSIM_KERNEL; y < 16 - VP8_SSIM_KERNEL; y++) {
    for (x = VP8_SSIM_KERNEL; x < 16 - VP8_SSIM_KERNEL; x++) {
      sum += VP8SSIMGetClipped(yuv1 + Y_OFF_ENC, BPS, yuv2 + Y_OFF_ENC, BPS,
                               x, y, 16, 16);
    }
  }
  for (x = 1; x < 7; x++) {
    for (y = 1; y < 7; y++) {
      sum += VP8SSIMGetClipped(yuv1 + U_OFF_ENC, BPS, yuv2 + U_OFF_ENC, BPS,
                               x, y, 8, 8);
      sum += VP8SSIMGetClipped(yuv1 + V_OFF_ENC, BPS, yuv2 + V_OFF_ENC, BPS,
                               x, y, 8, 8);
    }
  }
  return sum;
}